

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Refal2::CParser::parsingDirective(CParser *this)

{
  CParser *this_local;
  
  CDirectiveParser::AddToken(&this->super_CDirectiveParser);
  checkFinished(this);
  return;
}

Assistant:

void CParser::parsingDirective()
{
	CDirectiveParser::AddToken();
	checkFinished();
}